

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.h
# Opt level: O2

void __thiscall Memory::LargeHeapBucket::LargeHeapBucket(LargeHeapBucket *this)

{
  HeapBucket::HeapBucket(&this->super_HeapBucket);
  this->pendingSweepLargeBlockList = (LargeHeapBlock *)0x0;
  this->partialSweptLargeBlockList = (LargeHeapBlock *)0x0;
  this->largePageHeapBlockList = (LargeHeapBlock *)0x0;
  this->pendingDisposeLargeBlockList = (LargeHeapBlock *)0x0;
  this->fullLargeBlockList = (LargeHeapBlock *)0x0;
  this->largeBlockList = (LargeHeapBlock *)0x0;
  this->supportFreeList = false;
  this->freeList = (LargeHeapBlockFreeList *)0x0;
  this->explicitFreeList = (FreeObject *)0x0;
  return;
}

Assistant:

LargeHeapBucket():
        supportFreeList(false),
        freeList(nullptr),
        explicitFreeList(nullptr),
        fullLargeBlockList(nullptr),
        largeBlockList(nullptr),
#ifdef RECYCLER_PAGE_HEAP
        largePageHeapBlockList(nullptr),
#endif
        pendingDisposeLargeBlockList(nullptr)
#if ENABLE_CONCURRENT_GC
        , pendingSweepLargeBlockList(nullptr)
#if ENABLE_PARTIAL_GC
        , partialSweptLargeBlockList(nullptr)
#endif
#endif
    {
    }